

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testgem.cpp
# Opt level: O1

void test_arcs(Am_Drawonable *d)

{
  Am_Time aAStack_38 [8];
  
  Am_Time::Am_Time(aAStack_38,0);
  Am_Drawonable::Process_Event(aAStack_38);
  Am_Time::~Am_Time(aAStack_38);
  (**(code **)(*(long *)d + 0x130))(d,&black,&white,0x82,0xa0,0x14,0x14,0,0x168,0,1);
  (**(code **)(*(long *)d + 0x130))(d,&black,&Am_No_Style,0x14,0x14,0x96,0x46,0,0xb4,0,1);
  (**(code **)(*(long *)d + 0x130))(d,&dash15,&red,0x32,0x8c,0x46,0x8c,0,0x168,0,1);
  (**(code **)(*(long *)d + 0x130))(d,&dash15,&blue,0x3c,0x28,0x5a,0x5a,300,0x10e,0,1);
  (**(code **)(*(long *)d + 0x130))(d,&black4,&green,0,0xffffffe2,0x32,300,0xf0,0x3c,0,1);
  (**(code **)(*(long *)d + 0x130))
            (d,&Am_No_Style,&blue,10,0xf0,0x118,0x32,0xffffffffffffffdc,0x48,0,1);
  (**(code **)(*(long *)d + 0x130))(d,&dash8,&red,0xfffffff6,0x46,300,200,0x17,0x2d,0,1);
  (**(code **)(*(long *)d + 0x130))(d,&dash20,&yellow,200,0xa0,0x50,0x50,0,0x168,0,1);
  (**(code **)(*(long *)d + 0x130))(d,&black,&Am_No_Style,0x32,0x8c,0x46,0x8c,0,0x168,0,1);
  (**(code **)(*(long *)d + 0x130))(d,&black,&Am_No_Style,0x3c,0x28,0x5a,0x5a,300,0x10e,0,1);
  (**(code **)(*(long *)d + 0x130))(d,&black,&Am_No_Style,200,0xa0,0x50,0x50,0,0x168,0,1);
  (**(code **)(*(long *)d + 0xa0))(d);
  return;
}

Assistant:

void
test_arcs(Am_Drawonable *d)
{
  d->Process_Event(0UL);

  d->Draw_Arc(black, white, 130, 160, 20, 20, 0, 360);
  d->Draw_Arc(black, Am_No_Style, 20, 20, 150, 70, 0, 180);
  d->Draw_Arc(dash15, red, 50, 140, 70, 140, 0, 360);
  d->Draw_Arc(dash15, blue, 60, 40, 90, 90, 300, 270);
  d->Draw_Arc(black4, green, 0, -30, 50, 300, 240, 60);
  d->Draw_Arc(Am_No_Style, blue, 10, 240, 280, 50, -36, 72);
  d->Draw_Arc(dash8, red, -10, 70, 300, 200, 23, 45);
  d->Draw_Arc(dash20, yellow, 200, 160, 80, 80, 0, 360);

  d->Draw_Arc(black, Am_No_Style, 50, 140, 70, 140);
  d->Draw_Arc(black, Am_No_Style, 60, 40, 90, 90, 300, 270);
  d->Draw_Arc(black, Am_No_Style, 200, 160, 80, 80);

  d->Flush_Output();
}